

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::PortalImageInfiniteLight::PDF_Le
          (PortalImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  Float FVar1;
  undefined8 in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  Vector3<float> VVar5;
  Float duv_dw;
  Point2f st;
  Bounds2f b;
  float local_5c;
  Tuple2<pbrt::Point2,_float> local_58;
  Tuple2<pbrt::Point2,_float> local_50;
  Tuple2<pbrt::Point2,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_40;
  Bounds2<float> local_30;
  undefined1 extraout_var [56];
  
  VVar5 = Normalize<float>(&ray->d);
  auVar2._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  auVar2._8_4_ = (uint)in_XMM0_Qa ^ 0x80000000;
  auVar2._12_4_ = (uint)((ulong)in_XMM0_Qa >> 0x20) ^ 0x80000000;
  local_40.z = -VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  local_40._0_8_ = vmovlps_avx(auVar2);
  auVar4._0_8_ = ImageFromRender(this,(Vector3f *)&local_40,&local_5c);
  auVar4._8_56_ = extraout_var;
  local_58 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4._0_16_);
  if ((local_5c != 0.0) || (NAN(local_5c))) {
    auVar3._8_4_ = 0x3f800000;
    auVar3._0_8_ = 0x3f8000003f800000;
    auVar3._12_4_ = 0x3f800000;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_50 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3);
    Bounds2<float>::Bounds2(&local_30,(Point2<float> *)&local_48,(Point2<float> *)&local_50);
    FVar1 = WindowedPiecewiseConstant2D::PDF(&this->distribution,(Point2f *)&local_58,&local_30);
    *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
    *pdfDir = FVar1 / local_5c;
  }
  else {
    *pdfDir = 0.0;
    *pdfPos = 0.0;
  }
  return;
}

Assistant:

void PortalImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos,
                                      Float *pdfDir) const {
    // TODO: negate here or???
    Vector3f w = -Normalize(ray.d);
    Float duv_dw;
    Point2f st = ImageFromRender(w, &duv_dw);

    if (duv_dw == 0) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Float pdf = distribution.PDF(st, b);

#if 0
    Normal3f n = Normal3f(portalFrame.z);
    *pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    *pdfDir = pdf / duv_dw;
}